

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O0

void __thiscall
draco::DirectBitEncoder::EncodeLeastSignificantBits32
          (DirectBitEncoder *this,int nbits,uint32_t value)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t value_l;
  int remaining;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = 0x20 - *(int *)(in_RDI + 0x1c);
  uVar2 = in_EDX << (0x20U - (char)in_ESI & 0x1f);
  if (iVar1 < in_ESI) {
    uVar2 = uVar2 >> (0x20U - (char)in_ESI & 0x1f);
    *(int *)(in_RDI + 0x1c) = in_ESI - iVar1;
    uVar3 = uVar2 >> ((byte)*(undefined4 *)(in_RDI + 0x1c) & 0x1f);
    *(uint *)(in_RDI + 0x18) = *(uint *)(in_RDI + 0x18) | uVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,uVar2),
               (value_type_conflict5 *)CONCAT44(iVar1,uVar3));
    *(uint *)(in_RDI + 0x18) = uVar2 << (0x20U - (char)*(undefined4 *)(in_RDI + 0x1c) & 0x1f);
  }
  else {
    uVar2 = uVar2 >> ((byte)*(undefined4 *)(in_RDI + 0x1c) & 0x1f);
    *(uint *)(in_RDI + 0x18) = *(uint *)(in_RDI + 0x18) | uVar2;
    *(int *)(in_RDI + 0x1c) = in_ESI + *(int *)(in_RDI + 0x1c);
    if (*(int *)(in_RDI + 0x1c) == 0x20) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,uVar2),
                 (value_type_conflict5 *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
      *(undefined4 *)(in_RDI + 0x18) = 0;
      *(undefined4 *)(in_RDI + 0x1c) = 0;
    }
  }
  return;
}

Assistant:

void EncodeLeastSignificantBits32(int nbits, uint32_t value) {
    DRACO_DCHECK_EQ(true, nbits <= 32);
    DRACO_DCHECK_EQ(true, nbits > 0);

    const int remaining = 32 - num_local_bits_;

    // Make sure there are no leading bits that should not be encoded and
    // start from here.
    value = value << (32 - nbits);
    if (nbits <= remaining) {
      value = value >> num_local_bits_;
      local_bits_ = local_bits_ | value;
      num_local_bits_ += nbits;
      if (num_local_bits_ == 32) {
        bits_.push_back(local_bits_);
        local_bits_ = 0;
        num_local_bits_ = 0;
      }
    } else {
      value = value >> (32 - nbits);
      num_local_bits_ = nbits - remaining;
      const uint32_t value_l = value >> num_local_bits_;
      local_bits_ = local_bits_ | value_l;
      bits_.push_back(local_bits_);
      local_bits_ = value << (32 - num_local_bits_);
    }
  }